

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall chrono::ChBody::ClampSpeed(ChBody *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if ((this->bflags & 0x100) != 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[0];
    dVar1 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[1];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar1 * dVar1;
    auVar2 = vfmadd231sd_fma(auVar6,auVar2,auVar2);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[2];
    auVar2 = vfmadd213sd_fma(auVar8,auVar8,auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[3];
    auVar2 = vfmadd213sd_fma(auVar3,auVar3,auVar2);
    if (auVar2._0_8_ < 0.0) {
      dVar1 = sqrt(auVar2._0_8_);
    }
    else {
      auVar2 = vsqrtsd_avx(auVar2,auVar2);
      dVar1 = auVar2._0_8_;
    }
    if ((double)this->max_wvel < dVar1 + dVar1) {
      dVar1 = (double)this->max_wvel / (dVar1 + dVar1);
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[0] =
           dVar1 * (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[0];
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[1] =
           dVar1 * (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[1];
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[2] =
           dVar1 * (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[2];
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[3] =
           dVar1 * (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[3];
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[0];
    dVar1 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[1];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar1 * dVar1;
    auVar2 = vfmadd231sd_fma(auVar7,auVar4,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
    auVar2 = vfmadd213sd_fma(auVar5,auVar5,auVar2);
    if (auVar2._0_8_ < 0.0) {
      dVar1 = sqrt(auVar2._0_8_);
    }
    else {
      auVar2 = vsqrtsd_avx(auVar2,auVar2);
      dVar1 = auVar2._0_8_;
    }
    if ((double)this->max_speed < dVar1) {
      dVar1 = (double)this->max_speed / dVar1;
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[0] =
           dVar1 * (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[0];
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[1] =
           dVar1 * (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[1];
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[2] =
           dVar1 * (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
    }
  }
  return;
}

Assistant:

bool ChBody::BFlagGet(BodyFlag mask) const {
    return (bflags & mask) != 0;
}